

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

int __thiscall
kj::anon_unknown_59::InMemoryDirectory::EntryImpl::init(EntryImpl *this,EVP_PKEY_CTX *ctx)

{
  DirectoryNode *params;
  Own<const_kj::Directory,_std::nullptr_t> *this_00;
  Directory *__fn;
  int in_ECX;
  DirectoryNode *in_RDX;
  void *__child_stack;
  void *in_R8;
  DirectoryNode *value_local;
  EntryImpl *this_local;
  
  params = mv<kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode>(in_RDX);
  this_00 = &OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
             ::
             init<kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode>
                       ((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                         *)(ctx + 0x18),params)->directory;
  __fn = Own<const_kj::Directory,_std::nullptr_t>::operator->(this_00);
  Directory::clone((Directory *)this,(__fn *)__fn,__child_stack,in_ECX,in_R8);
  return (int)this;
}

Assistant:

Own<const Directory> init(DirectoryNode&& value) {
      return node.init<DirectoryNode>(kj::mv(value)).directory->clone();
    }